

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O2

void __thiscall MismatchedTokenException::MismatchedTokenException(MismatchedTokenException *this)

{
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_50,"Mismatched Token: expecting any AST node",&local_51);
  ParserException::ParserException(&this->super_ParserException,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)&(this->super_ParserException).super_ANTLRException =
       &PTR__MismatchedTokenException_00213cf8;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->token).ref = (Ref *)0x0;
  (this->node).ref = (Ref *)0x0;
  (this->tokenText)._M_dataplus._M_p = (pointer)&(this->tokenText).field_2;
  (this->tokenText)._M_string_length = 0;
  (this->tokenText).field_2._M_local_buf[0] = '\0';
  BitSet::BitSet(&this->set,0x40);
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException()
: ParserException("Mismatched Token: expecting any AST node")
, token(0)
, node(0)
{}